

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O2

void __thiscall Refal2::CQualifierParser::addQualifier(CQualifierParser *this)

{
  bool bVar1;
  CQualifier qualifier;
  CQualifier CStack_58;
  
  CQualifier::CQualifier(&CStack_58);
  bVar1 = CModuleBuilder::GetNamedQualifier(&this->super_CModuleBuilder,&this->token,&CStack_58);
  if (bVar1) {
    CQualifierBuilder::AddQualifier(&this->builder,&CStack_58);
    this->afterRightParen = false;
  }
  else {
    CParsingElementState::SetWrong(&this->super_CParsingElementState);
  }
  CQualifier::~CQualifier(&CStack_58);
  return;
}

Assistant:

void CQualifierParser::addQualifier()
{
	CQualifier qualifier;
	if( CModuleBuilder::GetNamedQualifier( token, qualifier ) ) {
		builder.AddQualifier( qualifier );
		afterRightParen = false;
	} else {
		SetWrong();
	}
}